

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O1

void __thiscall Nova::Simplex_Mesh<3>::Initialize_Neighbor_Nodes(Simplex_Mesh<3> *this)

{
  pointer pAVar1;
  Array<Nova::Array<int>_> *pAVar2;
  pointer pVVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  int *x;
  bool bVar11;
  allocator_type local_59;
  ulong local_58;
  int *local_50;
  value_type local_48;
  
  pAVar2 = this->neighbor_nodes;
  if (pAVar2 != (Array<Nova::Array<int>_> *)0x0) {
    std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar2->_data);
    operator_delete(pAVar2);
  }
  pAVar2 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::vector
            ((vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_> *)pAVar2,
             this->number_of_nodes,&local_48,&local_59);
  this->neighbor_nodes = pAVar2;
  if (local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pVVar3 = (this->elements)._data.
           super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->elements)._data.
                super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
  if (lVar4 != 0) {
    uVar5 = (lVar4 >> 2) * -0x5555555555555555;
    local_58 = 0;
    do {
      uVar6 = (ulong)(int)local_58;
      uVar7 = uVar6;
      if (uVar5 <= uVar6) {
LAB_0010c3c5:
        uVar8 = uVar7;
        pcVar9 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
LAB_0010c3dd:
        std::__throw_out_of_range_fmt(pcVar9,uVar8,uVar5);
      }
      local_50 = (int *)(pVVar3 + uVar6);
      bVar11 = true;
      uVar8 = 0;
      do {
        uVar10 = 0;
        x = local_50;
        do {
          if (uVar8 != uVar10) {
            if (!bVar11) {
              pcVar9 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
              uVar5 = 3;
              goto LAB_0010c3dd;
            }
            uVar7 = (ulong)*(int *)((long)pVVar3[uVar6]._data._M_elems + uVar8 * 4);
            pAVar1 = (this->neighbor_nodes->_data).
                     super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(this->neighbor_nodes->_data).
                           super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 3) *
                    -0x5555555555555555;
            if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_0010c3c5;
            Array<int>::Append_Unique(pAVar1 + uVar7,x);
          }
          uVar10 = uVar10 + 1;
          x = x + 1;
        } while (uVar10 != 3);
        bVar11 = uVar8 < 2;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 3);
      local_58 = local_58 + 1;
      pVVar3 = (this->elements)._data.
               super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->elements)._data.
                     super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 2) *
              -0x5555555555555555;
    } while (local_58 < uVar5);
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Neighbor_Nodes()
{
    if(neighbor_nodes!=nullptr) delete neighbor_nodes;
    neighbor_nodes=new Array<Array<int>>(number_of_nodes);
    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) for(int j=0;j<d;++j) if(i!=j) (*neighbor_nodes)(element[i]).Append_Unique(element[j]);}
}